

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c_json_parser.c
# Opt level: O2

void gen_field_match(fb_output_t *out,fb_compound_type_t *ct,void *data,int hint,int n)

{
  long lVar1;
  ushort uVar2;
  uint16_t uVar3;
  ushort uVar4;
  short sVar5;
  fb_scalar_type_t scalar_type;
  long lVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  byte bVar22;
  int iVar23;
  byte bVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  bool bVar27;
  char *__format;
  char *pcVar28;
  char cVar29;
  bool bVar30;
  char cVar31;
  double dVar32;
  ulong local_2d0;
  char *local_298;
  char *local_280;
  char local_258 [104];
  fb_scoped_name_t snref;
  fb_symbol_text_t scope_name;
  
  bVar9 = 0;
  println(out,"buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, %d);",n);
  println(out,"if (mark != buf) {");
  out->indent = out->indent + 1;
  memset(&snref,0,0xe8);
  __flatcc_fb_copy_scope(ct->scope,scope_name);
  uVar2 = *(ushort *)((long)data + 0x28);
  if (uVar2 < 0x11) {
    bVar17 = false;
    if ((0x10500U >> (uVar2 & 0x1f) & 1) != 0) {
      bVar17 = true;
      bVar9 = 1;
    }
  }
  else {
    bVar17 = false;
  }
  uVar3 = (ct->symbol).kind;
  uVar4 = *(ushort *)((long)data + 0x74);
  bVar16 = true;
  switch(uVar2) {
  case 8:
    cVar31 = *(long *)((long)data + 0x90) != 0;
    scalar_type = *(fb_scalar_type_t *)((long)data + 0x18);
    bVar24 = (byte)((ushort)*(undefined2 *)((long)data + 0x70) >> 8);
    bVar22 = bVar24 >> 2 & 1;
    bVar24 = bVar24 >> 3 & 1;
    break;
  case 9:
    scalar_type = *(fb_scalar_type_t *)((long)data + 0x18);
    bVar22 = 0;
    bVar24 = 0;
    cVar31 = false;
    break;
  case 10:
  case 0xb:
    bVar16 = false;
    bVar21 = true;
    goto LAB_00111be7;
  default:
    bVar21 = false;
LAB_00111be7:
    bVar10 = false;
    bVar30 = false;
    bVar15 = false;
    bVar13 = false;
    bVar27 = false;
    bVar22 = 0;
    bVar24 = 0;
    cVar31 = false;
    bVar19 = false;
    local_2d0 = 0;
    scalar_type = fb_missing_type;
    goto LAB_00111c24;
  case 0xf:
  case 0x10:
  case 0x14:
    fb_compound_name(*(fb_compound_type_t **)((long)data + 0x18),&snref);
    sVar5 = *(short *)(*(long *)((long)data + 0x18) + 0x10);
    bVar27 = hint == 0 && sVar5 == 4;
    bVar30 = sVar5 != 3;
    if (bVar30) {
      scalar_type = fb_missing_type;
    }
    else {
      scalar_type = *(fb_scalar_type_t *)(*(long *)((long)data + 0x18) + 0x50);
    }
    bVar15 = sVar5 == 0;
    bVar13 = sVar5 == 1;
    bVar10 = !bVar30;
    bVar16 = true;
    bVar30 = !bVar30;
    bVar21 = false;
    bVar24 = 0;
    local_2d0 = 0;
    cVar31 = false;
    bVar19 = false;
    bVar22 = 0;
    goto LAB_00111c24;
  case 0x11:
    scalar_type = *(fb_scalar_type_t *)((long)data + 0x18);
    local_2d0 = (ulong)*(uint *)((long)data + 0x2c);
    bVar21 = false;
    bVar30 = true;
    bVar10 = false;
    bVar15 = false;
    bVar13 = false;
    bVar27 = false;
    bVar22 = 0;
    bVar24 = 0;
    cVar31 = false;
    bVar19 = true;
    goto LAB_00111c24;
  }
  bVar10 = false;
  bVar21 = false;
  bVar27 = false;
  bVar30 = true;
  bVar13 = false;
  bVar15 = false;
  bVar19 = false;
  local_2d0 = 0;
LAB_00111c24:
  if (*(short *)((long)data + 0x28) == 0x14) {
    if (uVar3 != 1) {
      __assert_fail("is_struct_container",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                    ,0x1df,
                    "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)")
      ;
    }
    local_2d0 = (ulong)*(uint *)((long)data + 0x2c);
    bVar19 = true;
  }
  if (bVar22 != 0 || bVar24 != 0) {
    bVar17 = false;
    bVar30 = false;
    cVar31 = false;
    if (!(bool)(bVar9 & scalar_type == fb_ubyte)) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
              ,0x1e6,"internal error: unexpected base64 or base64url field type\n");
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                    ,0x1e6,
                    "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)")
      ;
    }
  }
  bVar11 = !bVar17;
  if (hint != 0) {
    bVar30 = false;
    bVar17 = false;
  }
  bVar18 = bVar17;
  if (bVar27) {
    bVar18 = false;
  }
  bVar20 = (bool)(scalar_type == fb_char & bVar19 & bVar30);
  if (bVar20) {
    bVar30 = false;
    bVar19 = false;
  }
  if ((bool)cVar31 != false) {
    println(out,"if (buf != end && *buf == \'[\') { /* begin nested */");
    out->indent = out->indent + 1;
  }
  lVar1 = (ulong)(scalar_type - fb_ulong) * 4;
  local_298 = "n/a";
  local_280 = "n/a";
  do {
    cVar29 = cVar31;
    if (cVar29 == '\x02') {
      if (out->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x202,
                      "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                     );
      }
      out->indent = out->indent + -1;
      bVar18 = false;
      println(out,"} else { /* nested */");
      out->indent = out->indent + 1;
      fb_compound_name(*(fb_compound_type_t **)((long)data + 0x90),&snref);
      bVar8 = true;
      if (*(short *)(*(long *)((long)data + 0x90) + 0x10) != 0) {
        bVar13 = bVar8;
        bVar8 = bVar15;
      }
      println(out,"if (flatcc_builder_start_buffer(ctx->ctx, 0, 0, 0)) goto failed;");
      bVar30 = false;
      bVar15 = bVar8;
    }
    bVar12 = !bVar30;
    bVar8 = hint == 0;
    bVar14 = !bVar13;
    if (bVar30) {
      if (0xb < scalar_type - fb_ulong) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c.h"
                ,0x66,"internal error: unexpected type during code generation");
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c.h"
                      ,0x66,"const char *scalar_type_prefix(fb_scalar_type_t)");
      }
      local_298 = &DAT_0013ba7c + *(int *)(&DAT_0013ba7c + lVar1);
      local_280 = &DAT_0013baac + *(int *)(&DAT_0013baac + lVar1);
    }
    if (bVar18) {
      if ((bVar12 && bVar8) && bVar14) {
        println(out,"if (flatcc_builder_start_offset_vector(ctx->ctx)) goto failed;");
      }
      else {
        lVar6 = *(long *)((long)data + 0x80);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = lVar6 + (ulong)(lVar6 == 0);
        println(out,
                "if (flatcc_builder_start_vector(ctx->ctx, %lu, %hu, UINT64_C(%lu))) goto failed;",
                lVar6,(ulong)(uint)(int)*(short *)((long)data + 0x72),
                SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffff)) / auVar7,0));
      }
    }
    if (bVar19) {
      println(out,"size_t count = %d;",local_2d0);
      if (bVar30) {
        println(out,"%s *base = (%s *)((size_t)struct_base + %lu);",local_280);
      }
      else {
        println(out,"void *base = (void *)((size_t)struct_base + %lu);",
                *(undefined8 *)((long)data + 0x78));
      }
    }
    if (bVar20) {
      println(out,"char *base = (char *)((size_t)struct_base + %lu);",
              *(undefined8 *)((long)data + 0x78));
      println(out,"buf = flatcc_json_parser_char_array(ctx, buf, end, base, %d);",local_2d0);
    }
    if (bVar18 || bVar19) {
      println(out,"buf = flatcc_json_parser_array_start(ctx, buf, end, &more);");
      println(out,"while (more) {");
      out->indent = out->indent + 1;
    }
    if (bVar30) {
      println(out,"%s val = 0;",local_280);
      println(out,"static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {");
      out->indent = out->indent + 2;
      if (bVar10) {
        println(out,"%s_parse_json_enum,",&snref);
      }
      println(out,"%s_local_%sjson_parser_enum,",out->S->basename,scope_name);
      println(out,"%s_global_json_parser_enum, 0 };",out->S->basename);
      iVar23 = out->indent;
      if ((iVar23 == 0) || (out->indent = iVar23 + -1, iVar23 + -1 == 0)) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x246,
                      "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                     );
      }
      out->indent = iVar23 + -2;
    }
    if (bVar18 && ((!bVar12 || !bVar8) || !bVar14)) {
      println(out,"if (!(pval = flatcc_builder_extend_vector(ctx->ctx, 1))) goto failed;");
    }
    if (uVar3 == 1) {
      if (!bVar20 && !bVar19) {
        println(out,"pval = (void *)((size_t)struct_base + %lu);",*(undefined8 *)((long)data + 0x78)
               );
      }
    }
    else if ((!bVar18) && (bVar13)) {
      println(out,"if (!(pval = flatcc_builder_table_add(ctx->ctx, %lu, %lu, %u))) goto failed;",
              *(undefined8 *)((long)data + 0x88),*(undefined8 *)((long)data + 0x80),
              (ulong)*(ushort *)((long)data + 0x72));
    }
    if (!bVar30) {
      if (bVar13) {
        if (!bVar19) {
          pcVar28 = "buf = %s_parse_json_struct_inline(ctx, buf, end, pval);";
LAB_001122b5:
          println(out,pcVar28,&snref);
          goto LAB_001124ba;
        }
        println(out,"if (count) {");
        out->indent = out->indent + 1;
        println(out,"buf = %s_parse_json_struct_inline(ctx, buf, end, base);",&snref);
        println(out,"--count;");
        println(out,"base = (void *)((size_t)base + %lu);",
                *(undefined8 *)(*(long *)((long)data + 0x18) + 0xc0));
        if (out->indent == 0) {
          __assert_fail("out->indent",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                        ,0x27f,
                        "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                       );
        }
        out->indent = out->indent + -1;
        println(out,"} else if (!(ctx->flags & flatcc_json_parser_f_skip_array_overflow)) {");
        out->indent = out->indent + 1;
        println(out,
                "return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_array_overflow);"
               );
        if (out->indent == 0) {
          __assert_fail("out->indent",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                        ,0x281,
                        "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                       );
        }
        out->indent = out->indent + -1;
        pcVar28 = "}";
LAB_001122d3:
        println(out,pcVar28);
      }
      else {
        if (!bVar16) {
          pcVar28 = "buf = flatcc_json_parser_build_string(ctx, buf, end, &ref);";
          goto LAB_001122d3;
        }
        if (bVar22 != 0 || bVar24 != 0) {
          println(out,"buf = flatcc_json_parser_build_uint8_vector_base64(ctx, buf, end, &ref, %u);"
                  ,(ulong)(bVar22 ^ 1));
          goto LAB_001124ba;
        }
        if (bVar15) {
          pcVar28 = "buf = %s_parse_json_table(ctx, buf, end, &ref);";
          goto LAB_001122b5;
        }
        if (bVar27) {
          uVar25 = *(undefined8 *)((long)data + 0x88);
          uVar26 = *(undefined8 *)((long)data + 0xa0);
          if ((bool)(bVar27 & bVar17)) {
            pcVar28 = 
            "buf = flatcc_json_parser_union_vector(ctx, buf, end, %lu, %lu, h_unions, %s_parse_json_union);"
            ;
          }
          else {
            pcVar28 = 
            "buf = flatcc_json_parser_union(ctx, buf, end, %lu, %lu, h_unions, %s_parse_json_union);"
            ;
          }
LAB_00112775:
          println(out,pcVar28,uVar26,uVar25,&snref);
        }
        else if (hint == 0) {
          if (!bVar18 && !bVar20) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                    ,0x2a3,"internal error: unexpected type for trie member\n");
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                          ,0x2a3,
                          "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                         );
          }
        }
        else {
          println(out,"static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {");
          out->indent = out->indent + 2;
          println(out,"%s_parse_json_enum,",&snref);
          println(out,"%s_local_%sjson_parser_enum,",out->S->basename,scope_name);
          println(out,"%s_global_json_parser_enum, 0 };",out->S->basename);
          iVar23 = out->indent;
          if ((iVar23 == 0) || (out->indent = iVar23 + -1, iVar23 + -1 == 0)) {
            __assert_fail("out->indent",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                          ,0x29a,
                          "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                         );
          }
          out->indent = iVar23 + -2;
          uVar25 = *(undefined8 *)((long)data + 0x88);
          uVar26 = *(undefined8 *)((long)data + 0xa0);
          if (hint == 0 || bVar11) {
            pcVar28 = 
            "buf = flatcc_json_parser_union_type(ctx, buf, end, %lu, %lu, h_unions, symbolic_parsers, %s_parse_json_union);"
            ;
            goto LAB_00112775;
          }
          println(out,
                  "buf = flatcc_json_parser_union_type_vector(ctx, buf, end, %lu, %lu, h_unions, symbolic_parsers, %s_parse_json_union, %s_json_union_accept_type);"
                  ,uVar26,uVar25,&snref,&snref);
        }
      }
      goto LAB_001124ba;
    }
    println(out,"buf = flatcc_json_parser_%s(ctx, (mark = buf), end, &val);",local_298);
    println(out,"if (mark == buf) {");
    out->indent = out->indent + 1;
    println(out,
            "buf = flatcc_json_parser_symbolic_%s(ctx, (mark = buf), end, symbolic_parsers, &val);",
            local_298);
    println(out,"if (buf == mark || buf == end) goto failed;");
    if (out->indent == 0) {
      __assert_fail("out->indent",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                    ,0x25c,
                    "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)")
      ;
    }
    out->indent = out->indent + -1;
    println(out,"}");
    if ((uVar3 == 1 || bVar18) || (bVar22 != 0 || bVar24 != 0)) goto LAB_001123cc;
    if ((uVar4 & 1) != 0) goto LAB_001123a8;
    switch(*(undefined2 *)((long)data + 0x58)) {
    case 4:
      dVar32 = *(double *)((long)data + 0x48);
      if (scalar_type == fb_float) {
        dVar32 = (double)(float)dVar32;
        pcVar28 = "%#.9gf";
      }
      else {
        pcVar28 = "%#.17g";
      }
      iVar23 = sprintf(local_258,pcVar28,dVar32);
      break;
    case 5:
      pcVar28 = scalar_cast(scalar_type);
      uVar25 = *(undefined8 *)((long)data + 0x48);
      __format = "%s(%ld)";
      goto LAB_00112345;
    case 6:
      pcVar28 = scalar_cast(scalar_type);
      uVar25 = *(undefined8 *)((long)data + 0x48);
      __format = "%s(%lu)";
LAB_00112345:
      iVar23 = sprintf(local_258,__format,pcVar28,uVar25);
      break;
    case 7:
      pcVar28 = scalar_cast(scalar_type);
      iVar23 = sprintf(local_258,"%s(%u)",pcVar28,(ulong)*(byte *)((long)data + 0x48));
      break;
    default:
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c.h"
              ,0x11a,"internal error: unexpected type during code generation");
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c.h"
                    ,0x11a,"size_t print_literal(fb_scalar_type_t, const fb_value_t *, char *)");
    }
    if (iVar23 == 0) goto LAB_0011285d;
    println(out,"if (val != %s || (ctx->flags & flatcc_json_parser_f_force_add)) {",local_258);
    out->indent = out->indent + 1;
LAB_001123a8:
    println(out,"if (!(pval = flatcc_builder_table_add(ctx->ctx, %lu, %lu, %hu))) goto failed;",
            *(undefined8 *)((long)data + 0x88),*(undefined8 *)((long)data + 0x80),
            (ulong)(uint)(int)*(short *)((long)data + 0x72));
LAB_001123cc:
    if (bVar19) {
      println(out,"if (count) {");
      out->indent = out->indent + 1;
      println(out,"%s%s_write_to_pe(base, val);",out,local_298);
      println(out,"--count;");
      println(out,"++base;");
      if (out->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x270,
                      "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                     );
      }
      out->indent = out->indent + -1;
      println(out,"} else if (!(ctx->flags & flatcc_json_parser_f_skip_array_overflow)) {");
      out->indent = out->indent + 1;
      println(out,
              "return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_array_overflow);"
             );
      if (out->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x272,
                      "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                     );
      }
      out->indent = out->indent + -1;
      println(out,"}");
    }
    else {
      println(out,"%s%s_write_to_pe(pval, val);",out,local_298);
    }
    if ((uVar3 == 1 || bVar18) || (uVar4 & 1) != 0) {
LAB_001124ba:
      if (bVar18) {
        if ((bVar12 && bVar8) && bVar14) {
          println(out,
                  "if (!ref || !(pref = flatcc_builder_extend_offset_vector(ctx->ctx, 1))) goto failed;"
                 );
          println(out,"*pref = ref;");
        }
        println(out,"buf = flatcc_json_parser_array_end(ctx, buf, end, &more);");
        if (out->indent == 0) {
          __assert_fail("out->indent",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                        ,0x2ae,
                        "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                       );
        }
        out->indent = out->indent + -1;
        println(out,"}");
        pcVar28 = "ref = flatcc_builder_end_vector(ctx->ctx);";
        if ((bVar12 && bVar8) && bVar14) {
          pcVar28 = "ref = flatcc_builder_end_offset_vector(ctx->ctx);";
        }
        goto LAB_00112555;
      }
    }
    else {
      if (out->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x277,
                      "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                     );
      }
      out->indent = out->indent + -1;
      pcVar28 = "}";
LAB_00112555:
      println(out,pcVar28);
    }
    if (bVar19) {
      println(out,"buf = flatcc_json_parser_array_end(ctx, buf, end, &more);");
      if (out->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x2b7,
                      "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                     );
      }
      out->indent = out->indent + -1;
      println(out,"}");
      println(out,"if (count) {");
      out->indent = out->indent + 1;
      println(out,"if (ctx->flags & flatcc_json_parser_f_reject_array_underflow) {");
      out->indent = out->indent + 1;
      println(out,
              "return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_array_underflow);"
             );
      if (out->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,699,
                      "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                     );
      }
      out->indent = out->indent + -1;
      println(out,"}");
      if (bVar30) {
        println(out,"memset(base, 0, count * sizeof(*base));");
      }
      else {
        println(out,"memset(base, 0, count * %lu);",
                *(undefined8 *)(*(long *)((long)data + 0x18) + 0xc0));
      }
      if (out->indent == 0) {
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x2c1,
                      "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)"
                     );
      }
      out->indent = out->indent + -1;
      println(out,"}");
    }
    cVar31 = '\x02';
  } while (cVar29 == '\x01');
  if (cVar29 == '\x02') {
    println(out,"if (!ref) goto failed;");
    println(out,"ref = flatcc_builder_end_buffer(ctx->ctx, ref);");
    if (out->indent == 0) {
      __assert_fail("out->indent",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                    ,0x2ca,
                    "int gen_field_match_handler(fb_output_t *, fb_compound_type_t *, void *, int)")
      ;
    }
    out->indent = out->indent + -1;
    println(out,"} /* end nested */");
  }
  if (((bVar21 || bVar22 != 0) || bVar24 != 0) || ((bVar18 || cVar29 != '\0') || bVar15)) {
    println(out,"if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, %lu))) goto failed;"
            ,*(undefined8 *)((long)data + 0x88));
    println(out,"*pref = ref;");
  }
LAB_0011285d:
  if (out->indent == 0) {
    __assert_fail("out->indent",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                  ,0x2d8,
                  "void gen_field_match(fb_output_t *, fb_compound_type_t *, void *, int, int)");
  }
  out->indent = out->indent + -1;
  println(out,"} else {");
  out->indent = out->indent + 1;
  return;
}

Assistant:

static void gen_field_match(fb_output_t *out, fb_compound_type_t *ct, void *data, int hint, int n)
{
    println(out, "buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, %d);", n);
    println(out, "if (mark != buf) {"); indent();
    gen_field_match_handler(out, ct, data, hint);
    unindent(); println(out, "} else {"); indent();
}